

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert_viaFormat
               (void *sP,ECOLOR_FORMAT sF,s32 sN,void *dP,ECOLOR_FORMAT dF)

{
  int iVar1;
  
  switch(sF) {
  case ECF_A1R5G5B5:
    switch(dF) {
    case ECF_A1R5G5B5:
switchD_002155c7_caseD_1:
      iVar1 = sN * 2;
      break;
    case ECF_R5G6B5:
      convert_A1R5G5B5toR5G6B5(sP,sN,dP);
      return;
    case ECF_R8G8B8:
      convert_A1R5G5B5toR8G8B8(sP,sN,dP);
      return;
    case ECF_A8R8G8B8:
      convert_A1R5G5B5toA8R8G8B8(sP,sN,dP);
      return;
    default:
      goto switchD_00215538_default;
    }
    break;
  case ECF_R5G6B5:
    switch(dF) {
    case ECF_A1R5G5B5:
      convert_R5G6B5toA1R5G5B5(sP,sN,dP);
      return;
    case ECF_R5G6B5:
      goto switchD_002155c7_caseD_1;
    case ECF_R8G8B8:
      convert_R5G6B5toR8G8B8(sP,sN,dP);
      return;
    case ECF_A8R8G8B8:
      convert_R5G6B5toA8R8G8B8(sP,sN,dP);
      return;
    default:
      goto switchD_00215538_default;
    }
  case ECF_R8G8B8:
    switch(dF) {
    case ECF_A1R5G5B5:
      convert_R8G8B8toA1R5G5B5(sP,sN,dP);
      return;
    case ECF_R5G6B5:
      convert_R8G8B8toR5G6B5(sP,sN,dP);
      return;
    case ECF_R8G8B8:
      iVar1 = sN * 3;
      break;
    case ECF_A8R8G8B8:
      convert_R8G8B8toA8R8G8B8(sP,sN,dP);
      return;
    default:
      goto switchD_00215538_default;
    }
    break;
  case ECF_A8R8G8B8:
    switch(dF) {
    case ECF_A1R5G5B5:
      convert_A8R8G8B8toA1R5G5B5(sP,sN,dP);
      return;
    case ECF_R5G6B5:
      convert_A8R8G8B8toR5G6B5(sP,sN,dP);
      return;
    case ECF_R8G8B8:
      convert_A8R8G8B8toR8G8B8(sP,sN,dP);
      return;
    case ECF_A8R8G8B8:
      iVar1 = sN << 2;
      goto LAB_0021562a;
    }
  default:
switchD_00215538_default:
    return;
  }
LAB_0021562a:
  memcpy(dP,sP,(long)iVar1);
  return;
}

Assistant:

void CColorConverter::convert_viaFormat(const void *sP, ECOLOR_FORMAT sF, s32 sN,
		void *dP, ECOLOR_FORMAT dF)
{
	// please also update can_convert_viaFormat when adding new conversions
	switch (sF) {
	case ECF_A1R5G5B5:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_A1R5G5B5toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_A1R5G5B5toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_A1R5G5B5toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_A1R5G5B5toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_R5G6B5:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_R5G6B5toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_R5G6B5toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_R5G6B5toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_R5G6B5toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_A8R8G8B8:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_A8R8G8B8toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_A8R8G8B8toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_A8R8G8B8toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_A8R8G8B8toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_R8G8B8:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_R8G8B8toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_R8G8B8toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_R8G8B8toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_R8G8B8toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;

	default:
		break;
	}
}